

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase489::run(TestCase489 *this)

{
  Reader reader;
  bool bVar1;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  int in_R8D;
  int callCount;
  WaitScope waitScope;
  ArrayPtr<const_char> local_238;
  Client client;
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  Client client2;
  Client client1;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response1;
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> promise2;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  request2;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> promise1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request1;
  EventLoop loop;
  Maybe<capnp::MessageSize> local_48;
  Maybe<capnp::MessageSize> local_30;
  
  kj::EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  kj::EventLoop::enterScope(&loop);
  callCount = 0;
  kj::heap<capnp::_::(anonymous_namespace)::TestExtendsDynamicImpl,int&>
            ((kj *)&response1,&callCount);
  DynamicCapability::Client::Client<capnp::_::(anonymous_namespace)::TestExtendsDynamicImpl,void>
            ((Client *)&response2,
             (Own<capnp::_::(anonymous_namespace)::TestExtendsDynamicImpl> *)&response1);
  Capability::Client::castAs<capnproto_test::capnp::test::TestExtends>
            (&client1,(Client *)&response2);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&response2);
  kj::Own<capnp::_::(anonymous_namespace)::TestExtendsDynamicImpl>::~Own
            ((Own<capnp::_::(anonymous_namespace)::TestExtendsDynamicImpl> *)&response1);
  capnproto_test::capnp::test::TestInterface::Client::Client
            (&client2,(Client *)(&client1.field_0x0 + *(long *)(client1._0_8_ + -0x20)));
  Capability::Client::castAs<capnproto_test::capnp::test::TestExtends>
            (&client,(Client *)(client2._vptr_Client[-3] + (long)&client2._vptr_Client));
  local_30.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&request1,(Client *)(&client.field_0x0 + *(long *)(client._0_8_ + -0x20)),&local_30);
  *(undefined4 *)request1.super_Builder._builder.data = 0x141;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)&promise1,(int)&request1,__buf,in_RCX,in_R8D);
  local_48.ptr.isSet = false;
  capnproto_test::capnp::test::TestExtends::Client::graultRequest(&request2,&client,&local_48);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
          *)&promise2,(int)&request2,__buf_00,in_RCX,in_R8D);
  if ((callCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    response2.super_Reader._reader.segment._0_4_ = 0;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x1fb,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)&response2,&callCount);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)&response2,
             &promise2);
  reader._reader.segment._4_4_ = response2.super_Reader._reader.segment._4_4_;
  reader._reader.segment._0_4_ = response2.super_Reader._reader.segment._0_4_;
  reader._reader.capTable = response2.super_Reader._reader.capTable;
  reader._reader.data = response2.super_Reader._reader.data;
  reader._reader.pointers = response2.super_Reader._reader.pointers;
  reader._reader.dataSize = response2.super_Reader._reader.dataSize;
  reader._reader.pointerCount = response2.super_Reader._reader.pointerCount;
  reader._reader._38_2_ = response2.super_Reader._reader._38_2_;
  reader._reader.nestingLimit = response2.super_Reader._reader.nestingLimit;
  reader._reader._44_4_ = response2.super_Reader._reader._44_4_;
  checkTestMessage(reader);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &response1,&promise1);
  local_238 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                        (&response1.super_Reader);
  bVar1 = kj::operator==("bar",(StringPtr *)&local_238);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    local_238 = (ArrayPtr<const_char>)
                capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                          (&response1.super_Reader);
    kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x203,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (response1.getX())\", \"bar\", response1.getX()"
               ,(char (*) [47])"failed: expected (\"bar\") == (response1.getX())",
               (char (*) [4])0x501447,(Reader *)&local_238);
  }
  if ((callCount != 2) && (kj::_::Debug::minSeverity < 3)) {
    local_238.ptr._0_4_ = 2;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x205,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
               (char (*) [36])"failed: expected (2) == (callCount)",(int *)&local_238,&callCount);
  }
  kj::Own<capnp::ResponseHook>::dispose(&response1.hook);
  kj::Own<capnp::ResponseHook>::dispose(&response2.hook);
  RemotePromise<capnproto_test::capnp::test::TestAllTypes>::~RemotePromise(&promise2);
  kj::Own<capnp::RequestHook>::dispose(&request2.hook);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise(&promise1);
  kj::Own<capnp::RequestHook>::dispose(&request1.hook);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&client.field_0x8);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&client2.field_0x8);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&client1.field_0x8);
  kj::WaitScope::~WaitScope(&waitScope);
  kj::EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Capability, DynamicServerInheritance) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  test::TestExtends::Client client1 =
      DynamicCapability::Client(kj::heap<TestExtendsDynamicImpl>(callCount))
          .castAs<test::TestExtends>();
  test::TestInterface::Client client2 = client1;
  auto client = client2.castAs<test::TestExtends>();

  auto request1 = client.fooRequest();
  request1.setI(321);
  auto promise1 = request1.send();

  auto request2 = client.graultRequest();
  auto promise2 = request2.send();

  EXPECT_EQ(0, callCount);

  auto response2 = promise2.wait(waitScope);

  checkTestMessage(response2);

  auto response1 = promise1.wait(waitScope);

  EXPECT_EQ("bar", response1.getX());

  EXPECT_EQ(2, callCount);
}